

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::Tracer_testTracerSimpleChild_Test::~Tracer_testTracerSimpleChild_Test
          (Tracer_testTracerSimpleChild_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Tracer, testTracerSimpleChild)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer = std::static_pointer_cast<Tracer>(opentracing::Tracer::Global());
    {
        auto spanRoot = tracer->StartSpan("test-simple-root");
        ASSERT_TRUE(spanRoot);
        auto spanChild = tracer->StartSpan("test-simple-child",
            { opentracing::ChildOf(&spanRoot->context()) });
        ASSERT_TRUE(spanChild);
    }
    tracer->Close();
}